

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_object_clear(JSON_Object *object)

{
  JSON_Value *pJVar1;
  JSON_Object *in_RDI;
  size_t i;
  JSON_Value *value;
  JSON_Value *local_18;
  JSON_Status local_4;
  
  if (in_RDI == (JSON_Object *)0x0) {
    local_4 = -1;
  }
  else {
    local_18 = (JSON_Value *)0x0;
    while( true ) {
      value = local_18;
      pJVar1 = (JSON_Value *)json_object_get_count(in_RDI);
      if (pJVar1 <= value) break;
      (*parson_free)(in_RDI->names[(long)local_18]);
      in_RDI->names[(long)local_18] = (char *)0x0;
      json_value_free(value);
      in_RDI->values[(long)local_18] = (JSON_Value *)0x0;
      local_18 = (JSON_Value *)((long)&local_18->parent + 1);
    }
    in_RDI->count = 0;
    for (local_18 = (JSON_Value *)0x0; local_18 < in_RDI->cell_capacity;
        local_18 = (JSON_Value *)((long)local_18 + 1)) {
      in_RDI->cells[(long)local_18] = 0xffffffffffffffff;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

JSON_Status json_object_clear(JSON_Object *object) {
    size_t i = 0;
    if (object == NULL) {
        return JSONFailure;
    }
    for (i = 0; i < json_object_get_count(object); i++) {
        parson_free(object->names[i]);
        object->names[i] = NULL;
        
        json_value_free(object->values[i]);
        object->values[i] = NULL;
    }
    object->count = 0;
    for (i = 0; i < object->cell_capacity; i++) {
        object->cells[i] = OBJECT_INVALID_IX;
    }
    return JSONSuccess;
}